

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConeRecord1.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::ConeRecord1::Decode(ConeRecord1 *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  ConeRecord1 *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x38) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = KDataStream::operator>>(local_18,&(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->super_EnvironmentRecord).m_ui16Length);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->super_EnvironmentRecord).m_ui8Index);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->super_EnvironmentRecord).m_ui8Padding);
  pKVar2 = operator>>(pKVar2,&(this->m_Loc).super_DataTypeBase);
  pKVar2 = operator>>(pKVar2,&(this->m_Ori).super_DataTypeBase);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32Height);
  pKVar2 = KDataStream::operator>>(pKVar2,(float *)&this->m_f32PeakAngle);
  KDataStream::operator>>(pKVar2,&this->m_ui32Padding);
  return;
}

Assistant:

void ConeRecord1::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < CONE_RECORD_1_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui32EnvRecTyp
           >> m_ui16Length
           >> m_ui8Index
           >> m_ui8Padding
           >> KDIS_STREAM m_Loc
           >> KDIS_STREAM m_Ori
           >> m_f32Height
           >> m_f32PeakAngle
           >> m_ui32Padding;
}